

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O1

int picnic_validate_keypair(picnic_privatekey_t *sk,picnic_publickey_t *pk)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  picnic_instance_t *lowmc;
  ulong __n;
  mzd_local_t ciphertext [1];
  mzd_local_t privkey [1];
  mzd_local_t plaintext [1];
  uint8_t buffer [32];
  mzd_local_t local_e0;
  mzd_local_t local_c0;
  mzd_local_t local_a0;
  uint8_t local_80 [80];
  
  iVar3 = -1;
  if (pk != (picnic_publickey_t *)0x0 && sk != (picnic_privatekey_t *)0x0) {
    bVar1 = sk->data[0];
    lowmc = picnic_instance_get((uint)bVar1);
    if ((lowmc != (picnic_instance_t *)0x0) && (bVar1 == pk->data[0])) {
      __n = (ulong)lowmc->input_output_size;
      iVar2 = bcmp(sk->data + __n * 2 + 1,pk->data + __n + 1,__n);
      if (iVar2 == 0) {
        iVar2 = bcmp(sk->data + __n + 1,pk->data + 1,__n);
        if (iVar2 == 0) {
          mzd_from_char_array(&local_a0,sk->data + __n * 2 + 1,(ulong)lowmc->input_output_size);
          mzd_from_char_array(&local_c0,sk->data + 1,(ulong)lowmc->input_output_size);
          lowmc_compute(&lowmc->lowmc,&local_c0,&local_a0,&local_e0);
          mzd_to_char_array(local_80,&local_e0,(ulong)lowmc->input_output_size);
          iVar3 = memcmp(local_80,pk->data + 1,(ulong)lowmc->input_output_size);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_validate_keypair(const picnic_privatekey_t* sk,
                                                      const picnic_publickey_t* pk) {
  if (!sk || !pk) {
    return -1;
  }

  const picnic_params_t param       = sk->data[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_pt = SK_PT(sk, instance);
  const uint8_t* sk_c  = SK_C(sk, instance);
  const uint8_t* pk_pt = PK_PT(pk, instance);
  const uint8_t* pk_c  = PK_C(pk);

  // check param and plaintext
  if (param != pk->data[0] || memcmp(sk_pt, pk_pt, instance->input_output_size) != 0 ||
      memcmp(sk_c, pk_c, instance->input_output_size) != 0) {
    return -1;
  }

  mzd_local_t plaintext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t privkey[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t ciphertext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];

  mzd_from_char_array(plaintext, sk_pt, instance->input_output_size);
  mzd_from_char_array(privkey, sk_sk, instance->input_output_size);

  // compute public key
  lowmc_compute(&instance->lowmc, privkey, plaintext, ciphertext);

  uint8_t buffer[MAX_LOWMC_BLOCK_SIZE];
  mzd_to_char_array(buffer, ciphertext, instance->input_output_size);

  return memcmp(buffer, pk_c, instance->input_output_size);
}